

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_q4_1(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  long lVar1;
  float *pfVar2;
  float *x;
  ulong uVar3;
  int j;
  float fVar4;
  float fVar5;
  uint extraout_XMM0_Db;
  undefined1 auVar6 [16];
  float fVar7;
  uint uVar8;
  uint uVar10;
  undefined1 auVar9 [16];
  uint uVar11;
  uint uVar13;
  float fVar14;
  undefined1 auVar12 [16];
  uint8_t L [32];
  uint8_t Laux [32];
  float weight [32];
  int in_stack_fffffffffffffeb0;
  float *pfVar15;
  float local_134;
  long local_130;
  float *local_128;
  long local_120;
  size_t local_118;
  int64_t local_110;
  long local_108;
  ulong local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint8_t local_d8 [32];
  float local_b8 [34];
  
  local_128 = quant_weights;
  if (quant_weights == (float *)0x0) {
    quantize_row_q4_1_ref(src,(block_q4_1 *)dst,n_per_row * nrow);
    local_118 = ggml_row_size(GGML_TYPE_Q4_1,n_per_row);
  }
  else {
    local_118 = ggml_row_size(GGML_TYPE_Q4_1,n_per_row);
    if (0 < nrow) {
      local_100 = (ulong)n_per_row >> 5;
      local_120 = n_per_row * 4;
      local_108 = 0;
      local_130 = n_per_row;
      local_110 = nrow;
      do {
        pfVar15 = src;
        if (0 < local_130) {
          fVar7 = 0.0;
          lVar1 = 0;
          do {
            fVar7 = fVar7 + src[lVar1] * src[lVar1];
            lVar1 = lVar1 + 1;
          } while (local_130 != lVar1);
          if (0x1f < local_130) {
            uVar3 = 0;
            pfVar2 = local_128;
            do {
              x = pfVar15 + uVar3 * 0x20;
              lVar1 = 0;
              do {
                fVar5 = pfVar2[lVar1];
                fVar4 = src[lVar1] * src[lVar1] + fVar7 / (float)n_per_row;
                if (fVar4 < 0.0) {
                  fVar4 = sqrtf(fVar4);
                }
                else {
                  fVar4 = SQRT(fVar4);
                }
                local_b8[lVar1] = fVar5 * fVar4;
                lVar1 = lVar1 + 1;
              } while (lVar1 != 0x20);
              fVar5 = make_qkx3_quants(0x20,0xf,x,local_b8,local_f8,&local_134,local_d8,fVar4,
                                       fVar7 / (float)n_per_row,in_stack_fffffffffffffeb0,
                                       SUB81(pfVar15,0));
              uVar8 = (int)fVar5 * 2 ^ 0x80000000;
              uVar10 = (int)local_134 * 2 ^ 0x80000000;
              uVar11 = -(uint)(-0xf000001 < (int)uVar8);
              uVar13 = -(uint)(-0xf000001 < (int)uVar10);
              fVar4 = (float)(~uVar11 & 0x40000000 | ((uint)fVar5 & 0x7f800000) + 0x7800000 & uVar11
                             ) + ABS(fVar5) * 5.192297e+33 * 7.70372e-34;
              fVar14 = (float)(~uVar13 & 0x40000000 |
                              ((uint)-local_134 & 0x7f800000) + 0x7800000 & uVar13) +
                       ABS(local_134) * 5.192297e+33 * 7.70372e-34;
              auVar12._0_4_ = ((uint)fVar4 & 0xfff) + ((uint)fVar4 >> 0xd & 0x7c00);
              auVar12._4_4_ = ((uint)fVar14 & 0xfff) + ((uint)fVar14 >> 0xd & 0x7c00);
              auVar12._8_8_ = 0;
              auVar9._0_4_ = -(uint)(0x7f000000 < (int)uVar8);
              auVar9._4_4_ = -(uint)(0x7f000000 < (int)uVar10);
              auVar9._8_4_ = -(uint)(0 < (int)(extraout_XMM0_Db * 2 ^ 0x80000000));
              auVar9._12_4_ = 0;
              auVar6._0_4_ = (uint)fVar5 >> 0x10;
              auVar6._4_4_ = (uint)-local_134 >> 0x10;
              auVar6._8_4_ = extraout_XMM0_Db >> 0x10;
              auVar6._12_4_ = 0x8000;
              auVar6 = pshuflw(~auVar9 & auVar12,
                               auVar9 & _DAT_0014e670 | auVar6 & _DAT_0014e650 | ~auVar9 & auVar12,
                               0xe8);
              *(int *)((long)dst + uVar3 * 0x14) = auVar6._0_4_;
              auVar6 = psllw(local_e8,4);
              *(undefined1 (*) [16])((long)dst + uVar3 * 0x14 + 4) =
                   auVar6 & _DAT_0014e5c0 | local_f8;
              uVar3 = uVar3 + 1;
              src = src + 0x20;
              pfVar2 = pfVar2 + 0x20;
            } while (uVar3 != local_100);
          }
        }
        src = (float *)((long)pfVar15 + local_120);
        dst = (void *)((long)dst + local_118);
        local_108 = local_108 + 1;
        nrow = local_110;
      } while (local_108 != local_110);
    }
  }
  return local_118 * nrow;
}

Assistant:

size_t quantize_q4_1(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    if (!quant_weights) {
        quantize_row_q4_1_ref(src, dst, (int64_t)nrow*n_per_row);
        return nrow * ggml_row_size(GGML_TYPE_Q4_1, n_per_row);
    }
    size_t row_size = ggml_row_size(GGML_TYPE_Q4_1, n_per_row);
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_q4_1_impl(src, (block_q4_1*)qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += row_size;
    }
    return nrow * row_size;
}